

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void lys_switch_deviation(lys_deviation *dev,lys_module *module,unres_schema *unres)

{
  LYS_NODE LVar1;
  lys_node *plVar2;
  lys_ext_instance **pplVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  undefined4 uVar10;
  int iVar11;
  char *pcVar12;
  lys_module *plVar13;
  char *pcVar14;
  lys_node *plVar15;
  lys_node *plVar16;
  size_t __n;
  ly_ctx *ctx;
  lys_node *plVar17;
  undefined8 uVar18;
  long local_a8;
  lys_ext_instance **pplStack_a0;
  lys_iffeature *local_98;
  ly_set *local_38;
  ly_set *set;
  
  if (dev->deviate == (lys_deviate *)0x0) {
    return;
  }
  if (dev->deviate->mod == LY_DEVIATE_NO) {
    pcVar14 = dev->target_name;
    plVar16 = dev->orig_node;
    if (plVar16 == (lys_node *)0x0) {
      iVar11 = resolve_schema_nodeid(pcVar14,(lys_node *)0x0,module,&local_38,0,1);
      if (iVar11 == -1) {
        ctx = module->ctx;
        uVar18 = 0x11b6;
        goto LAB_00164150;
      }
      plVar16 = *(local_38->set).s;
      ly_set_free(local_38);
      plVar17 = plVar16->parent;
      lys_node_unlink(plVar16);
      if (plVar17 != (lys_node *)0x0) {
        plVar15 = plVar16;
        if ((plVar17->nodetype & (LYS_AUGMENT|LYS_USES)) == LYS_UNKNOWN) {
          if ((plVar17->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN) goto LAB_001641f1;
          plVar15 = (lys_node *)calloc(1,0x78);
          if (plVar15 == (lys_node *)0x0) {
            ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lys_switch_deviation");
            return;
          }
          LVar1 = plVar16->nodetype;
          plVar15->nodetype = LVar1;
          pcVar14 = "output";
          if (LVar1 == LYS_INPUT) {
            pcVar14 = "input";
          }
          pcVar14 = lydict_insert(module->ctx,pcVar14,0);
          plVar15->name = pcVar14;
          plVar15->module = plVar16->module;
          plVar15->flags = 0x40;
          plVar2 = plVar17->child;
          if (((plVar2 == (lys_node *)0x0) || (plVar2->next != (lys_node *)0x0)) ||
             (plVar2->nodetype != (uint)(plVar15->nodetype == LYS_INPUT) * 0x200 + LYS_INPUT)) {
            __assert_fail("parent->child && !parent->child->next && (parent->child->nodetype == (inout->nodetype == LYS_INPUT ? LYS_OUTPUT : LYS_INPUT))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                          ,0x11d3,
                          "void lys_switch_deviation(struct lys_deviation *, const struct lys_module *, struct unres_schema *)"
                         );
          }
          plVar2->next = plVar15;
          plVar15->prev = plVar2;
          plVar2->prev = plVar15;
        }
        plVar15->parent = plVar17;
      }
LAB_001641f1:
      dev->orig_node = plVar16;
      return;
    }
    pcVar12 = strrchr(pcVar14,0x2f);
    if ((long)pcVar12 - (long)pcVar14 == 0) {
      plVar13 = plVar16->module;
      if ((plVar13->field_0x40 & 1) != 0) {
        plVar13 = (lys_module *)plVar13->data;
      }
      plVar17 = (lys_node *)0x0;
    }
    else {
      plVar17 = plVar16->parent;
      if (plVar17 == (lys_node *)0x0) {
LAB_0016425c:
        pcVar14 = strndup(pcVar14,(long)pcVar12 - (long)pcVar14);
        iVar11 = resolve_schema_nodeid(pcVar14,(lys_node *)0x0,module,&local_38,0,1);
        free(pcVar14);
        if (iVar11 == -1) {
          ctx = module->ctx;
          uVar18 = 0x11a3;
LAB_00164150:
          ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                 ,uVar18);
          ly_set_free(local_38);
          return;
        }
        plVar17 = *(local_38->set).s;
        ly_set_free(local_38);
        plVar16 = dev->orig_node;
        plVar13 = (lys_module *)0x0;
      }
      else {
        if (plVar17->nodetype != LYS_USES) {
          if (plVar17->nodetype != LYS_AUGMENT) goto LAB_0016425c;
          plVar16->parent = (lys_node *)0x0;
          if ((plVar17->flags & 1) == 0) {
            remove_aug((lys_node_augment *)plVar17);
            lys_node_addchild(plVar17,(lys_module *)0x0,dev->orig_node,0);
            plVar13 = plVar17->module;
            if ((plVar13->field_0x40 & 1) != 0) {
              plVar13 = (lys_module *)plVar13->data;
            }
            if ((plVar13->field_0x40 & 0x80) == 0) {
              __assert_fail("lys_node_module(parent)->implemented",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                            ,0x1196,
                            "void lys_switch_deviation(struct lys_deviation *, const struct lys_module *, struct unres_schema *)"
                           );
            }
            *(byte *)&plVar17->flags = (byte)plVar17->flags | 1;
            apply_aug((lys_node_augment *)plVar17,unres);
            goto LAB_001642df;
          }
        }
        plVar13 = (lys_module *)0x0;
      }
    }
    lys_node_addchild(plVar17,plVar13,plVar16,0);
LAB_001642df:
    dev->orig_node = (lys_node *)0x0;
    return;
  }
  iVar11 = resolve_schema_nodeid(dev->target_name,(lys_node *)0x0,module,&local_38,0,1);
  if (iVar11 == -1) {
    ctx = module->ctx;
    uVar18 = 0x11df;
    goto LAB_00164150;
  }
  plVar16 = *(local_38->set).s;
  ly_set_free(local_38);
  plVar17 = dev->orig_node;
  if (((plVar16->module != plVar17->module) || (plVar16->name != plVar17->name)) ||
     (plVar16->nodetype != plVar17->nodetype)) {
    __assert_fail("(node1->module == node2->module) && ly_strequal(node1->name, node2->name, 1) && (node1->nodetype == node2->nodetype)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0xe2b,"void lys_node_switch(struct lys_node *, struct lys_node *)");
  }
  local_98 = plVar16->iffeature;
  local_a8._0_2_ = plVar16->flags;
  local_a8._2_1_ = plVar16->ext_size;
  local_a8._3_1_ = plVar16->iffeature_size;
  local_a8._4_1_ = plVar16->padding[0];
  local_a8._5_1_ = plVar16->padding[1];
  local_a8._6_1_ = plVar16->padding[2];
  local_a8._7_1_ = plVar16->padding[3];
  pplStack_a0 = plVar16->ext;
  plVar16->iffeature = plVar17->iffeature;
  uVar4 = plVar17->ext_size;
  uVar5 = plVar17->iffeature_size;
  uVar6 = plVar17->padding[0];
  uVar7 = plVar17->padding[1];
  uVar8 = plVar17->padding[2];
  uVar9 = plVar17->padding[3];
  pplVar3 = plVar17->ext;
  plVar16->flags = plVar17->flags;
  plVar16->ext_size = uVar4;
  plVar16->iffeature_size = uVar5;
  plVar16->padding[0] = uVar6;
  plVar16->padding[1] = uVar7;
  plVar16->padding[2] = uVar8;
  plVar16->padding[3] = uVar9;
  plVar16->ext = pplVar3;
  plVar17->iffeature = local_98;
  plVar17->flags = (undefined2)local_a8;
  plVar17->ext_size = local_a8._2_1_;
  plVar17->iffeature_size = local_a8._3_1_;
  plVar17->padding[0] = local_a8._4_1_;
  plVar17->padding[1] = local_a8._5_1_;
  plVar17->padding[2] = local_a8._6_1_;
  plVar17->padding[3] = local_a8._7_1_;
  plVar17->ext = pplStack_a0;
  LVar1 = plVar16->nodetype;
  if ((int)LVar1 < 0x80) {
    if ((int)LVar1 < 0x10) {
      switch(LVar1) {
      case LYS_CONTAINER:
        __n = 0x20;
        break;
      case LYS_CHOICE:
        goto switchD_00164079_caseD_2;
      default:
        goto switchD_00164079_caseD_3;
      case LYS_LEAF:
        __n = 0x60;
        break;
      case LYS_LEAFLIST:
        __n = 0x68;
      }
    }
    else if (LVar1 == LYS_LIST) {
      __n = 0x38;
    }
    else {
      if (LVar1 == LYS_ANYXML) goto LAB_0016423c;
      if (LVar1 != LYS_CASE) goto switchD_00164079_caseD_3;
      __n = 0;
    }
  }
  else {
    if ((int)LVar1 < 0x400) {
      if (LVar1 == LYS_NOTIF) {
LAB_0016423c:
        __n = 0x10;
        goto LAB_00164322;
      }
      if ((LVar1 != LYS_RPC) && (LVar1 != LYS_INPUT)) {
switchD_00164079_caseD_3:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                      ,0xe8f,"void lys_node_switch(struct lys_node *, struct lys_node *)");
      }
    }
    else if ((LVar1 != LYS_OUTPUT) && (LVar1 != LYS_ACTION)) {
      if (LVar1 != LYS_ANYDATA) goto switchD_00164079_caseD_3;
      goto LAB_0016423c;
    }
switchD_00164079_caseD_2:
    __n = 8;
  }
LAB_00164322:
  memcpy(&local_a8,plVar16 + 1,__n);
  memcpy(plVar16 + 1,plVar17 + 1,__n);
  memcpy(plVar17 + 1,&local_a8,__n);
  LVar1 = plVar16->nodetype;
  if (0x7f < (int)LVar1) {
    if ((int)LVar1 < 0x200) {
      if ((LVar1 != LYS_NOTIF) && (LVar1 != LYS_RPC)) {
        return;
      }
    }
    else {
      if ((LVar1 == LYS_INPUT) || (LVar1 == LYS_OUTPUT)) {
        *(undefined2 *)(plVar16->padding + 2) = *(undefined2 *)(plVar17->padding + 2);
        uVar4 = plVar17->hash[1];
        uVar5 = plVar17->hash[2];
        uVar6 = plVar17->hash[3];
        uVar10 = *(undefined4 *)&plVar17->field_0x6c;
        plVar16->hash[0] = plVar17->hash[0];
        plVar16->hash[1] = uVar4;
        plVar16->hash[2] = uVar5;
        plVar16->hash[3] = uVar6;
        *(undefined4 *)&plVar16->field_0x6c = uVar10;
        plVar17->padding[2] = '\0';
        plVar17->padding[3] = '\0';
        plVar17->hash[0] = '\0';
        plVar17->hash[1] = '\0';
        plVar17->hash[2] = '\0';
        plVar17->hash[3] = '\0';
        *(undefined4 *)&plVar17->field_0x6c = 0;
        return;
      }
      if (LVar1 != LYS_ACTION) {
        return;
      }
    }
    *(undefined2 *)(plVar16->padding + 2) = *(undefined2 *)(plVar17->padding + 2);
    plVar16[1].name = plVar17[1].name;
    plVar17->padding[2] = '\0';
    plVar17->padding[3] = '\0';
    plVar17[1].name = (char *)0x0;
    return;
  }
  if ((int)LVar1 < 8) {
    if (LVar1 == LYS_CONTAINER) {
      *(undefined2 *)(plVar16->padding + 2) = *(undefined2 *)(plVar17->padding + 2);
      plVar16[1].ref = plVar17[1].ref;
      plVar17->padding[2] = '\0';
      plVar17->padding[3] = '\0';
LAB_0016445b:
      plVar17[1].ref = (char *)0x0;
      return;
    }
    if (LVar1 != LYS_LEAF) {
      return;
    }
  }
  else if (LVar1 != LYS_LEAFLIST) {
    if (LVar1 != LYS_LIST) {
      return;
    }
    plVar16->padding[1] = plVar17->padding[1];
    plVar16[1].ref = plVar17[1].ref;
    plVar17->padding[1] = '\0';
    goto LAB_0016445b;
  }
  plVar16[1].iffeature = (lys_iffeature *)plVar16;
  plVar17[1].iffeature = (lys_iffeature *)plVar17;
  return;
}

Assistant:

static void
lys_switch_deviation(struct lys_deviation *dev, const struct lys_module *module, struct unres_schema *unres)
{
    int ret, reapply = 0;
    char *parent_path;
    struct lys_node *target = NULL, *parent;
    struct lys_node_inout *inout;
    struct ly_set *set;

    if (!dev->deviate) {
        return;
    }

    if (dev->deviate[0].mod == LY_DEVIATE_NO) {
        if (dev->orig_node) {
            /* removing not-supported deviation ... */
            if (strrchr(dev->target_name, '/') != dev->target_name) {
                /* ... from a parent */

                /* reconnect to its previous position */
                parent = dev->orig_node->parent;
                if (parent && (parent->nodetype == LYS_AUGMENT)) {
                    dev->orig_node->parent = NULL;
                    /* the original node was actually from augment, we have to get know if the augment is
                     * applied (its module is enabled and implemented). If yes, the node will be connected
                     * to the augment and the linkage with the target will be fixed if needed, otherwise
                     * it will be connected only to the augment */
                    if (!(parent->flags & LYS_NOTAPPLIED)) {
                        /* start with removing augment if applied before adding nodes, we have to make sure
                         * that everything will be connect correctly */
                        remove_aug((struct lys_node_augment *)parent);
                        reapply = 1;
                    }
                    /* connect the deviated node back into the augment */
                    lys_node_addchild(parent, NULL, dev->orig_node, 0);
                    if (reapply) {
                        /* augment is supposed to be applied, so fix pointers in target and the status of the original node */
                        assert(lys_node_module(parent)->implemented);
                        parent->flags |= LYS_NOTAPPLIED; /* allow apply_aug() */
                        apply_aug((struct lys_node_augment *)parent, unres);
                    }
                } else if (parent && (parent->nodetype == LYS_USES)) {
                    /* uses child */
                    lys_node_addchild(parent, NULL, dev->orig_node, 0);
                } else {
                    /* non-augment, non-toplevel */
                    parent_path = strndup(dev->target_name, strrchr(dev->target_name, '/') - dev->target_name);
                    ret = resolve_schema_nodeid(parent_path, NULL, module, &set, 0, 1);
                    free(parent_path);
                    if (ret == -1) {
                        LOGINT(module->ctx);
                        ly_set_free(set);
                        return;
                    }
                    target = set->set.s[0];
                    ly_set_free(set);

                    lys_node_addchild(target, NULL, dev->orig_node, 0);
                }
            } else {
                /* ... from top-level data */
                lys_node_addchild(NULL, lys_node_module(dev->orig_node), dev->orig_node, 0);
            }

            dev->orig_node = NULL;
        } else {
            /* adding not-supported deviation */
            ret = resolve_schema_nodeid(dev->target_name, NULL, module, &set, 0, 1);
            if (ret == -1) {
                LOGINT(module->ctx);
                ly_set_free(set);
                return;
            }
            target = set->set.s[0];
            ly_set_free(set);

            /* unlink and store the original node */
            parent = target->parent;
            lys_node_unlink(target);
            if (parent) {
                if (parent->nodetype & (LYS_AUGMENT | LYS_USES)) {
                    /* hack for augment, because when the original will be sometime reconnected back, we actually need
                     * to reconnect it to both - the augment and its target (which is deduced from the deviations target
                     * path), so we need to remember the augment as an addition */
                    /* we also need to remember the parent uses so that we connect it back to it when switching deviation state */
                    target->parent = parent;
                } else if (parent->nodetype & (LYS_RPC | LYS_ACTION)) {
                    /* re-create implicit node */
                    inout = calloc(1, sizeof *inout);
                    LY_CHECK_ERR_RETURN(!inout, LOGMEM(module->ctx), );

                    inout->nodetype = target->nodetype;
                    inout->name = lydict_insert(module->ctx, (inout->nodetype == LYS_INPUT) ? "input" : "output", 0);
                    inout->module = target->module;
                    inout->flags = LYS_IMPLICIT;

                    /* insert it manually */
                    assert(parent->child && !parent->child->next
                    && (parent->child->nodetype == (inout->nodetype == LYS_INPUT ? LYS_OUTPUT : LYS_INPUT)));
                    parent->child->next = (struct lys_node *)inout;
                    inout->prev = parent->child;
                    parent->child->prev = (struct lys_node *)inout;
                    inout->parent = parent;
                }
            }
            dev->orig_node = target;
        }
    } else {
        ret = resolve_schema_nodeid(dev->target_name, NULL, module, &set, 0, 1);
        if (ret == -1) {
            LOGINT(module->ctx);
            ly_set_free(set);
            return;
        }
        target = set->set.s[0];
        ly_set_free(set);

        /* contents are switched */
        lys_node_switch(target, dev->orig_node);
    }
}